

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O2

void ssh2_channel_check_close(ssh2_channel *c)

{
  ssh2_connection_state *psVar1;
  _Bool _Var2;
  uint uVar3;
  PktOut *pPVar4;
  
  if (c->halfopen == false) {
    psVar1 = c->connlayer;
    _Var2 = (*c->chan->vt->want_close)
                      (c->chan,(_Bool)((byte)c->closes & 1),SUB41((c->closes & 4U) >> 2,0));
    if (_Var2) {
      uVar3 = c->closes;
      if ((uVar3 & 2) == 0 && c->chanreq_head == (outstanding_channel_request *)0x0) {
        pPVar4 = (*((psVar1->ppl).bpp)->vt->new_pktout)(0x61);
        BinarySink_put_uint32(pPVar4->binarysink_,(ulong)c->remoteid);
        pq_base_push(&((psVar1->ppl).out_pq)->pqb,&pPVar4->qnode);
        uVar3 = c->closes | 3;
        c->closes = uVar3;
      }
    }
    else {
      uVar3 = c->closes;
    }
    if ((~uVar3 & 10) == 0) {
      if (c->chanreq_head == (outstanding_channel_request *)0x0) {
        ssh2_channel_destroy(c);
        return;
      }
      __assert_fail("c->chanreq_head == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection2.c"
                    ,0x438,"void ssh2_channel_check_close(struct ssh2_channel *)");
    }
  }
  return;
}

Assistant:

static void ssh2_channel_check_close(struct ssh2_channel *c)
{
    struct ssh2_connection_state *s = c->connlayer;
    PktOut *pktout;

    if (c->halfopen) {
        /*
         * If we've sent out our own CHANNEL_OPEN but not yet seen
         * either OPEN_CONFIRMATION or OPEN_FAILURE in response, then
         * it's too early to be sending close messages of any kind.
         */
        return;
    }

    if (chan_want_close(c->chan, (c->closes & CLOSES_SENT_EOF),
                        (c->closes & CLOSES_RCVD_EOF)) &&
        !c->chanreq_head &&
        !(c->closes & CLOSES_SENT_CLOSE)) {
        /*
         * We have both sent and received EOF (or the channel is a
         * zombie), and we have no outstanding channel requests, which
         * means the channel is in final wind-up. But we haven't sent
         * CLOSE, so let's do so now.
         */
        pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_CHANNEL_CLOSE);
        put_uint32(pktout, c->remoteid);
        pq_push(s->ppl.out_pq, pktout);
        c->closes |= CLOSES_SENT_EOF | CLOSES_SENT_CLOSE;
    }

    if (!((CLOSES_SENT_CLOSE | CLOSES_RCVD_CLOSE) & ~c->closes)) {
        assert(c->chanreq_head == NULL);
        /*
         * We have both sent and received CLOSE, which means we're
         * completely done with the channel.
         */
        ssh2_channel_destroy(c);
    }
}